

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

void __thiscall cmTarget::MaybeInvalidatePropertyCache(cmTarget *this,string *prop)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (this->IsImportedTarget == true) {
    std::__cxx11::string::string((string *)&local_40,(string *)prop);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,9ul>(&local_40,(char (*) [9])0x480713);
    std::__cxx11::string::~string((string *)&local_40);
    if (bVar1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmTarget::ImportInfo>_>_>
      ::clear(&(((this->Internal).Pointer)->ImportInfoMap)._M_t);
    }
  }
  if (this->IsImportedTarget == false) {
    std::__cxx11::string::string((string *)&local_60,(string *)prop);
    bVar1 = cmHasLiteralPrefix<std::__cxx11::string,16ul>
                      (&local_60,(char (*) [16])"LINK_INTERFACE_");
    std::__cxx11::string::~string((string *)&local_60);
    if (bVar1) {
      ClearLinkMaps(this);
    }
  }
  return;
}

Assistant:

void cmTarget::MaybeInvalidatePropertyCache(const std::string& prop)
{
  // Wipe out maps caching information affected by this property.
  if(this->IsImported() && cmHasLiteralPrefix(prop, "IMPORTED"))
    {
    this->Internal->ImportInfoMap.clear();
    }
  if(!this->IsImported() && cmHasLiteralPrefix(prop, "LINK_INTERFACE_"))
    {
    this->ClearLinkMaps();
    }
}